

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall
QPDFArgParser::getTopicHelp(QPDFArgParser *this,string *name,HelpTopic *ht,ostringstream *msg)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  
  if ((ht->long_text)._M_string_length == 0) {
    poVar1 = std::operator<<((ostream *)msg,(string *)ht);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    std::operator<<((ostream *)msg,(string *)&ht->long_text);
  }
  if ((ht->options)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    poVar1 = std::endl<char,std::char_traits<char>>((ostream *)msg);
    poVar1 = std::operator<<(poVar1,"Related options:");
    std::endl<char,std::char_traits<char>>(poVar1);
    for (p_Var3 = (ht->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(ht->options)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      poVar1 = std::operator<<((ostream *)msg,"  ");
      poVar1 = std::operator<<(poVar1,(string *)(p_Var3 + 1));
      poVar1 = std::operator<<(poVar1,": ");
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFArgParser::HelpTopic>_>_>
               ::operator[](&((this->m).
                              super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->option_help,(key_type *)(p_Var3 + 1));
      poVar1 = std::operator<<(poVar1,(string *)pmVar2);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
  }
  return;
}

Assistant:

void
QPDFArgParser::getTopicHelp(std::string const& name, HelpTopic const& ht, std::ostringstream& msg)
{
    if (ht.long_text.empty()) {
        msg << ht.short_text << std::endl;
    } else {
        msg << ht.long_text;
    }
    if (!ht.options.empty()) {
        msg << std::endl << "Related options:" << std::endl;
        for (auto const& i: ht.options) {
            msg << "  " << i << ": " << m->option_help[i].short_text << std::endl;
        }
    }
}